

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O1

void __thiscall
stateObservation::LipmDcmEstimator::resetWithMeasurements
          (LipmDcmEstimator *this,Vector2 *measuredDcm,Vector2 *measuredZMP,Matrix2 *yaw,
          bool measurementIsWithBias,Vector2 *initBias,Vector2 *initBiasuncertainty)

{
  double **ppdVar1;
  PointerType *ppdVar2;
  double dVar3;
  double dVar4;
  Index IVar5;
  undefined8 uVar6;
  assign_op<double,_double> *paVar7;
  variable_if_dynamic<long,__1> vVar8;
  undefined1 *puVar9;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar10;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar11;
  undefined8 *puVar12;
  long lVar13;
  char *__function;
  ulong uVar14;
  SrcEvaluatorType srcEvaluator;
  undefined3 in_register_00000081;
  SrcEvaluatorType srcEvaluator_3;
  SrcEvaluatorType srcEvaluator_1;
  DstEvaluatorType dstEvaluator;
  Matrix4 P;
  SrcEvaluatorType srcEvaluator_2;
  Vector4 x;
  SrcEvaluatorType srcEvaluator_4;
  DstEvaluatorType dstEvaluator_1;
  assign_op<double,_double> local_199;
  DstXprType local_198;
  KalmanFilterBase *local_160;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_158;
  undefined1 local_138 [32];
  Matrix<double,_4,_4,_0,_4,_4> local_118;
  plainobjectbase_evaluator_data<double,_0> local_98;
  Vector2 *pVStack_90;
  Vector2 *local_88;
  double dStack_80;
  undefined1 local_78 [32];
  SrcEvaluatorType local_58;
  DstEvaluatorType local_40;
  
  local_160 = &(this->filter_).super_KalmanFilterBase;
  KalmanFilterBase::reset(local_160);
  dVar3 = (measuredZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[1];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[0] = (measuredZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[1] = dVar3;
  dVar3 = (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
          [1];
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[0] =
       (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[0]
  ;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[1] = dVar3;
  dVar3 = (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
          [3];
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[2] =
       (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[2]
  ;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[3] = dVar3;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)local_78;
  if (CONCAT31(in_register_00000081,measurementIsWithBias) == 0) {
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 0.0;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = 4.94065645841247e-324;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = 9.88131291682493e-324;
    local_78._0_8_ =
         (measuredDcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
         m_data.array[0];
    local_78._8_8_ =
         (measuredDcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
         m_data.array[1];
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_118,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias);
    puVar9 = (undefined1 *)
             ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                     local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array[3])->m_storage).m_data.array +
             (long)local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1]);
    paVar7 = (assign_op<double,_double> *)
             local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array[2];
  }
  else {
    local_158.m_src = (SrcEvaluatorType *)0x0;
    local_158.m_functor = (assign_op<double,_double> *)0x1;
    local_158.m_dstExpr = (DstXprType *)0x2;
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
         &local_118;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 9.88131291682493e-324;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = 4.94065645841247e-324;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = 0.0;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = 0.0;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
         = 1.97626258336499e-323;
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&local_98;
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)local_138;
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)&local_58;
    local_158.m_dst =
         (DstEvaluatorType *)
         local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0];
    local_138._0_8_ =
         local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0];
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0];
    pVStack_90 = measuredDcm;
    local_88 = initBias;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_198);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_158,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias);
    puVar9 = &((local_158.m_src)->
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              ).m_d.field_0x0 +
             (long)&((local_158.m_dstExpr)->
                    super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
    ;
    paVar7 = local_158.m_functor;
  }
  if ((puVar9 == (undefined1 *)0x4) && (paVar7 == (assign_op<double,_double> *)0x1)) {
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = 0.0;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 0.0;
    free((void *)0x0);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)malloc(0x20);
    if (((ulong)pMVar10 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pMVar10 == (Matrix<double,_4,_4,_0,_4,_4> *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = operator_delete;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)pMVar10;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 1.97626258336499e-323;
    lVar13 = 0;
    do {
      IVar5 = *(Index *)(local_78 + lVar13 * 8 + 8);
      ppdVar1 = (double **)
                ((long)(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                       m_storage.m_data.array + lVar13 * 8);
      *ppdVar1 = *(double **)(local_78 + lVar13 * 8);
      ppdVar1[1] = (double *)IVar5;
      lVar13 = lVar13 + 2;
    } while (lVar13 == 2);
    ZeroDelayObserver::setState(&local_160->super_ZeroDelayObserver,(StateVector *)&local_118,0);
    free((void *)local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0]);
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&local_118;
    if (measurementIsWithBias) {
      dVar3 = (initBiasuncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
              m_storage.m_data.array[0];
      dStack_80 = (initBiasuncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                  ).m_storage.m_data.array[1];
      local_98.data = (double *)(dVar3 * dVar3);
      dStack_80 = dStack_80 * dStack_80;
      pVStack_90 = (Vector2 *)0x0;
      local_88 = (Vector2 *)0x0;
      local_58.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)&this->R_;
      local_138._8_8_ = 0.0;
      local_138._16_8_ = (assign_op<double,_double> *)0x2;
      local_138._24_8_ = 9.88131291682493e-324;
      local_158.m_dstExpr = &local_198;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 2;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 2;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_158.m_src = &local_58;
      local_158.m_dst = &local_40;
      local_158.m_functor = &local_199;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           &local_118;
      local_138._0_8_ = &local_118;
      local_58.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)
           (evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)&local_98;
      local_40.super_block_evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_4,_4>_>
      .m_data = (PointerType)&local_118;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run(&local_158);
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)&local_98;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)local_138,
                           (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                            *)&local_198);
      local_158.m_dst = (DstEvaluatorType *)&local_98;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar11,
                           (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                            *)&local_158);
      Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar11,
                 (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_98);
      lVar13 = local_138._24_8_ + local_138._8_8_;
      vVar8.m_value = local_138._16_8_;
    }
    else {
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 2;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           (Matrix<double,_4,_4,_0,_4,_4> *)0x2;
      lVar13 = 0;
      do {
        puVar12 = (undefined8 *)
                  ((long)(this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                         m_storage.m_data.array + lVar13);
        uVar6 = puVar12[1];
        *(undefined8 *)
         ((long)local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar13 * 2) = *puVar12;
        *(undefined8 *)
         ((long)&local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage +
         lVar13 * 2 + 8) = uVar6;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x20);
      pVStack_90 = (Vector2 *)0x0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_198,
                           (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                            *)&local_98);
      local_138._8_8_ = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar11,
                           (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                            *)local_138);
      dVar3 = (initBiasuncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
              m_storage.m_data.array[0];
      dVar4 = (initBiasuncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
              m_storage.m_data.array[1];
      local_158.m_dst = (DstEvaluatorType *)(dVar3 * dVar3);
      local_158.m_dstExpr = (DstXprType *)(dVar4 * dVar4);
      local_158.m_src = (SrcEvaluatorType *)0x0;
      local_158.m_functor = (assign_op<double,_double> *)0x0;
      Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar11,
                 (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_158);
      lVar13 = (long)((local_198.
                       super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                      .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                     m_storage.m_data.array +
               local_198.
               super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
               m_rows.m_value;
      vVar8.m_value =
           local_198.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_cols.m_value;
    }
    if ((lVar13 == 4) &&
       ((assign_op<double,_double> *)vVar8.m_value == (assign_op<double,_double> *)0x4)) {
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)0x0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_198,0x10,4,4);
      if (((SrcEvaluatorType *)
           local_198.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_rows.m_value != (SrcEvaluatorType *)0x4) ||
         ((assign_op<double,_double> *)
          local_198.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols
          .m_value != (assign_op<double,_double> *)0x4)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&local_198,0x10,4,4);
      }
      if (((SrcEvaluatorType *)
           local_198.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_rows.m_value == (SrcEvaluatorType *)0x4) &&
         ((assign_op<double,_double> *)
          local_198.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols
          .m_value == (assign_op<double,_double> *)0x4)) {
        uVar14 = 0xfffffffffffffffe;
        do {
          uVar6 = *(undefined8 *)
                   ((long)&local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                           m_storage + uVar14 * 8 + 0x18);
          ppdVar2 = &(((DstEvaluatorType *)
                      ((long)local_198.
                             super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                             .
                             super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                             .
                             super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                             .
                             super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                             .m_data + 0x10))->
                     super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,__1,_false,_true>
                     ).
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_4,_1>_>
                     .m_data + uVar14;
          *ppdVar2 = *(PointerType *)
                      ((long)&local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                              .m_storage + uVar14 * 8 + 0x10);
          ppdVar2[1] = (PointerType)uVar6;
          uVar14 = uVar14 + 2;
        } while (uVar14 < 0xe);
        KalmanFilterBase::setStateCovariance(local_160,(Pmatrix *)&local_198);
        free(local_198.
             super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
             m_data);
        return;
      }
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 4, 4>, T1 = double, T2 = double]"
                   );
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
    ;
  }
  else {
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

void LipmDcmEstimator::resetWithMeasurements(const Vector2 & measuredDcm,
                                             const Vector2 & measuredZMP,
                                             const Matrix2 & yaw,
                                             bool measurementIsWithBias,
                                             const Vector2 & initBias,
                                             const Vector2 & initBiasuncertainty)

{
  filter_.reset();
  previousZmp_ = measuredZMP;
  previousOrientation_ = yaw;

  Vector4 x;

  /// initialize the state using the measurement
  if(measurementIsWithBias)
  {
    x << measuredDcm - initBias, initBias;
  }
  else
  {
    x << measuredDcm, initBias;
  }

  filter_.setState(x, 0);
  Matrix4 P;

  if(measurementIsWithBias)
  {
    Matrix2 initBiasCov = Vec2ToSqDiag_(initBiasuncertainty);
    /// The state and the
    // clang-format off
    P<< initBiasCov+R_, -initBiasCov,
       -initBiasCov,     initBiasCov;
    // clang-format on
  }
  else
  {
    // clang-format off
    P<< R_,               Matrix2::Zero(),
        Matrix2::Zero(),  Vec2ToSqDiag_(initBiasuncertainty);
    // clang-format on
  }

  filter_.setStateCovariance(P);
}